

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__getn(stbi__context *s,stbi_uc *buffer,int n)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *__src;
  int iVar3;
  size_t __n;
  
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    __src = s->img_buffer;
    psVar2 = s->img_buffer_end;
  }
  else {
    __src = s->img_buffer;
    psVar2 = s->img_buffer_end;
    iVar1 = (int)psVar2 - (int)__src;
    iVar3 = n - iVar1;
    if (iVar3 != 0 && iVar1 <= n) {
      memcpy(buffer,__src,(long)iVar1);
      iVar1 = (*(s->io).read)(s->io_user_data,(char *)(buffer + iVar1),iVar3);
      s->img_buffer = s->img_buffer_end;
      return (uint)(iVar1 == iVar3);
    }
  }
  __n = (size_t)n;
  if (__src + __n <= psVar2) {
    memcpy(buffer,__src,__n);
    s->img_buffer = s->img_buffer + __n;
  }
  return (uint)(__src + __n <= psVar2);
}

Assistant:

static int stbi__getn(stbi__context *s, stbi_uc *buffer, int n)
{
   if (s->io.read) {
      int blen = (int) (s->img_buffer_end - s->img_buffer);
      if (blen < n) {
         int res, count;

         memcpy(buffer, s->img_buffer, blen);

         count = (s->io.read)(s->io_user_data, (char*) buffer + blen, n - blen);
         res = (count == (n-blen));
         s->img_buffer = s->img_buffer_end;
         return res;
      }
   }

   if (s->img_buffer+n <= s->img_buffer_end) {
      memcpy(buffer, s->img_buffer, n);
      s->img_buffer += n;
      return 1;
   } else
      return 0;
}